

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egluUtil.cpp
# Opt level: O2

vector<void_*,_std::allocator<void_*>_> *
eglu::chooseConfigs(vector<void_*,_std::allocator<void_*>_> *__return_storage_ptr__,Library *egl,
                   EGLDisplay display,FilterList *filters)

{
  bool bVar1;
  pointer __x;
  vector<void_*,_std::allocator<void_*>_> allConfigs;
  _Vector_base<void_*,_std::allocator<void_*>_> local_40;
  
  getConfigs((vector<void_*,_std::allocator<void_*>_> *)&local_40,egl,display);
  (__return_storage_ptr__->super__Vector_base<void_*,_std::allocator<void_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<void_*,_std::allocator<void_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<void_*,_std::allocator<void_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  for (__x = local_40._M_impl.super__Vector_impl_data._M_start;
      __x != local_40._M_impl.super__Vector_impl_data._M_finish; __x = __x + 1) {
    bVar1 = FilterList::match(filters,egl,display,*__x);
    if (bVar1) {
      std::vector<void_*,_std::allocator<void_*>_>::push_back(__return_storage_ptr__,__x);
    }
  }
  std::_Vector_base<void_*,_std::allocator<void_*>_>::~_Vector_base(&local_40);
  return __return_storage_ptr__;
}

Assistant:

vector<EGLConfig> chooseConfigs (const Library& egl, EGLDisplay display, const FilterList& filters)
{
	const vector<EGLConfig>	allConfigs		(getConfigs(egl, display));
	vector<EGLConfig>		matchingConfigs;

	for (vector<EGLConfig>::const_iterator cfg = allConfigs.begin(); cfg != allConfigs.end(); ++cfg)
	{
		if (filters.match(egl, display, *cfg))
			matchingConfigs.push_back(*cfg);
	}

	return matchingConfigs;
}